

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O2

set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_> * __thiscall
covenant::CFG::computeGenerating
          (set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>
           *__return_storage_ptr__,CFG *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  size_type sVar3;
  pointer pvVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar4 = (this->prods).
           super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = 0;
  bVar8 = 0;
  do {
    while (uVar7 = (ulong)uVar6,
          (ulong)(((long)(this->prods).
                         super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18) <= uVar7
          ) {
      uVar6 = 0;
      bVar11 = bVar8 == 0;
      bVar8 = 0;
      if (bVar11) {
        return __return_storage_ptr__;
      }
    }
    uVar5 = 0;
    while( true ) {
      lVar2 = *(long *)&pvVar4[uVar7].
                        super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                        ._M_impl.super__Vector_impl_data;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar4[uVar7].
                                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                 ._M_impl.super__Vector_impl_data + 8) - lVar2 >> 2) <= (ulong)uVar5
         ) break;
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                (&RHS,(this->rules).
                      super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + *(int *)(lVar2 + (ulong)uVar5 * 4)
                );
      uVar9 = 0;
      bVar11 = true;
      while ((uVar10 = (ulong)uVar9,
             uVar10 < (ulong)((long)RHS.
                                    super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)RHS.
                                    super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2) && (bVar11))) {
        bVar11 = true;
        if ((RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
             super__Vector_impl_data._M_start[uVar10].x & 1) != 0) {
          sVar3 = std::set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>
                  ::count(__return_storage_ptr__,
                          RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                          _M_impl.super__Vector_impl_data._M_start + uVar10);
          bVar11 = sVar3 != 0;
        }
        uVar9 = uVar9 + 1;
      }
      if (bVar11) {
        bVar11 = InsertAndNotifyChange(this,__return_storage_ptr__,(Sym)(uVar6 * 2 + 1));
        bVar8 = bVar8 | bVar11;
      }
      std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base
                (&RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>);
      uVar5 = uVar5 + 1;
      pvVar4 = (this->prods).
               super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

set<Sym> computeGenerating()
    {
      set<Sym> GenSet;
      bool change=true;
      while (change)
      {
        change = false;
        for ( unsigned int vv = 0; vv < prods.size(); vv++ )
        {
          for ( unsigned int ri = 0; ri < prods[vv].size(); ri++ )
          {
            const int r = prods[vv][ri].rule;
            vector<Sym> RHS = rules[r];
            bool allSatisfy=true;
            for(unsigned si =0; (si < RHS.size() && allSatisfy) ; si++)
            {
              if (!(RHS[si].isTerm() || GenSet.count(RHS[si]) > 0))
                allSatisfy=false;
            }
            if (allSatisfy)
              change |= InsertAndNotifyChange(GenSet,Sym::mkVar(vv));
          }
        }
      }
      return GenSet;
    }